

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O0

void __thiscall Am_Time::operator-=(Am_Time *this,unsigned_long msec)

{
  long local_20;
  long total_usec;
  unsigned_long msec_local;
  Am_Time *this_local;
  
  local_20 = (this->data->time).tv_usec + msec * -1000;
  while (local_20 < 0) {
    local_20 = local_20 + 1000000;
    (this->data->time).tv_sec = (this->data->time).tv_sec + -1;
  }
  (this->data->time).tv_sec = (this->data->time).tv_sec + local_20 / 1000000;
  (this->data->time).tv_usec = local_20 % 1000000;
  return;
}

Assistant:

void
Am_Time::operator-=(unsigned long msec)
{
  long total_usec = data->time.tv_usec - msec * 1000;
  while (total_usec < 0) {
    total_usec += 1000000;
    data->time.tv_sec--;
  }
  data->time.tv_sec = data->time.tv_sec + total_usec / 1000000;
  data->time.tv_usec = total_usec % 1000000;
}